

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate>::reset
          (QSharedDataPointer<QSslPreSharedKeyAuthenticatorPrivate> *this,
          QSslPreSharedKeyAuthenticatorPrivate *ptr)

{
  Data *pDVar1;
  QSslPreSharedKeyAuthenticatorPrivate *pQVar2;
  
  pQVar2 = (this->d).ptr;
  if (pQVar2 != ptr) {
    if (ptr != (QSslPreSharedKeyAuthenticatorPrivate *)0x0) {
      LOCK();
      (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
      .super___atomic_base<int>._M_i =
           (ptr->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      pQVar2 = (this->d).ptr;
    }
    (this->d).ptr = ptr;
    if (pQVar2 != (QSslPreSharedKeyAuthenticatorPrivate *)0x0) {
      LOCK();
      (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           (pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
           _q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar2->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
          _q_value.super___atomic_base<int>._M_i == 0) {
        pDVar1 = (pQVar2->preSharedKey).d.d;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((pQVar2->preSharedKey).d.d)->super_QArrayData,1,0x10);
          }
        }
        pDVar1 = (pQVar2->identity).d.d;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((pQVar2->identity).d.d)->super_QArrayData,1,0x10);
          }
        }
        pDVar1 = (pQVar2->identityHint).d.d;
        if (pDVar1 != (Data *)0x0) {
          LOCK();
          (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&((pQVar2->identityHint).d.d)->super_QArrayData,1,0x10);
          }
        }
        operator_delete(pQVar2,0x60);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }